

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t despace_ssse3_cumsum(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint8_t *dst_1;
  byte *pbVar6;
  size_t sVar7;
  uint8_t *dst;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar5 = _DAT_001984c0;
  auVar4 = _DAT_00198490;
  pbVar6 = (byte *)dst_void;
  if (0xf < length) {
    auVar12[8] = 0x20;
    auVar12._0_8_ = 0x2020202020202020;
    auVar12[9] = 0x20;
    auVar12[10] = 0x20;
    auVar12[0xb] = 0x20;
    auVar12[0xc] = 0x20;
    auVar12[0xd] = 0x20;
    auVar12[0xe] = 0x20;
    auVar12[0xf] = 0x20;
    auVar13[8] = 1;
    auVar13._0_8_ = 0x101010101010101;
    auVar13[9] = 1;
    auVar13[10] = 1;
    auVar13[0xb] = 1;
    auVar13[0xc] = 1;
    auVar13[0xd] = 1;
    auVar13[0xe] = 1;
    auVar13[0xf] = 1;
    auVar14[8] = 0x70;
    auVar14._0_8_ = 0x7070707070707070;
    auVar14[9] = 0x70;
    auVar14[10] = 0x70;
    auVar14[0xb] = 0x70;
    auVar14[0xc] = 0x70;
    auVar14[0xd] = 0x70;
    auVar14[0xe] = 0x70;
    auVar14[0xf] = 0x70;
    auVar15[8] = 3;
    auVar15._0_8_ = 0x303030303030303;
    auVar15[9] = 3;
    auVar15[10] = 3;
    auVar15[0xb] = 3;
    auVar15[0xc] = 3;
    auVar15[0xd] = 3;
    auVar15[0xe] = 3;
    auVar15[0xf] = 3;
    auVar16[8] = 4;
    auVar16._0_8_ = 0x404040404040404;
    auVar16[9] = 4;
    auVar16[10] = 4;
    auVar16[0xb] = 4;
    auVar16[0xc] = 4;
    auVar16[0xd] = 4;
    auVar16[0xe] = 4;
    auVar16[0xf] = 4;
    auVar17._8_8_ = 0x1010101010101;
    auVar17._0_8_ = 0x1010101010101;
    do {
      auVar1 = *src_void;
      src_void = (void *)((long)src_void + 0x10);
      length = length - 0x10;
      auVar10 = vpaddusb_avx(auVar1,auVar14);
      auVar18 = vpcmpeqb_avx(auVar1,auVar12);
      auVar10 = vpshufb_avx(auVar4,auVar10);
      auVar10 = vpternlogq_avx512vl(auVar10,auVar18,auVar13,0xf8);
      auVar18 = vpsllq_avx(auVar10,8);
      uVar8 = vptestmb_avx512vl(auVar10,auVar10);
      auVar10 = vpaddb_avx(auVar10,auVar18);
      auVar18 = vpsllq_avx(auVar10,0x10);
      auVar10 = vpaddb_avx(auVar10,auVar18);
      auVar18 = vpsllq_avx(auVar10,0x20);
      auVar10 = vpaddb_avx(auVar10,auVar18);
      auVar11 = vmovdqu8_avx512vl(auVar10);
      auVar18[1] = ((byte)(uVar8 >> 1) & 1) * auVar11[1];
      auVar18[0] = ((byte)uVar8 & 1) * auVar11[0];
      auVar18[2] = ((byte)(uVar8 >> 2) & 1) * auVar11[2];
      auVar18[3] = ((byte)(uVar8 >> 3) & 1) * auVar11[3];
      auVar18[4] = ((byte)(uVar8 >> 4) & 1) * auVar11[4];
      auVar18[5] = ((byte)(uVar8 >> 5) & 1) * auVar11[5];
      auVar18[6] = ((byte)(uVar8 >> 6) & 1) * auVar11[6];
      auVar18[7] = ((byte)(uVar8 >> 7) & 1) * auVar11[7];
      auVar18[8] = ((byte)(uVar8 >> 8) & 1) * auVar11[8];
      auVar18[9] = ((byte)(uVar8 >> 9) & 1) * auVar11[9];
      auVar18[10] = ((byte)(uVar8 >> 10) & 1) * auVar11[10];
      auVar18[0xb] = ((byte)(uVar8 >> 0xb) & 1) * auVar11[0xb];
      auVar18[0xc] = ((byte)(uVar8 >> 0xc) & 1) * auVar11[0xc];
      auVar18[0xd] = ((byte)(uVar8 >> 0xd) & 1) * auVar11[0xd];
      auVar18[0xe] = ((byte)(uVar8 >> 0xe) & 1) * auVar11[0xe];
      auVar18[0xf] = (char)(uVar8 >> 0xf) * auVar11[0xf];
      auVar11 = vpshufb_avx(ZEXT816(0x100000001000000),auVar18);
      auVar19 = vpsrlq_avx(auVar18,9);
      uVar9 = vpcmpb_avx512vl(auVar18,auVar16,4);
      bVar3 = auVar10[7];
      auVar18 = vpand_avx(auVar19,auVar17);
      uVar8 = vpcmpgtb_avx512vl(auVar10,auVar15);
      uVar9 = uVar9 & uVar8;
      auVar11 = vpsrlq_avx(auVar11,0x10);
      auVar10 = vpaddb_avx(auVar10,auVar11);
      auVar10 = vpaddb_avx(auVar10,auVar18);
      auVar18 = vmovdqu8_avx512vl(auVar10);
      auVar11[1] = ((byte)(uVar9 >> 1) & 1) * auVar18[1];
      auVar11[0] = ((byte)uVar9 & 1) * auVar18[0];
      auVar11[2] = ((byte)(uVar9 >> 2) & 1) * auVar18[2];
      auVar11[3] = ((byte)(uVar9 >> 3) & 1) * auVar18[3];
      auVar11[4] = ((byte)(uVar9 >> 4) & 1) * auVar18[4];
      auVar11[5] = ((byte)(uVar9 >> 5) & 1) * auVar18[5];
      auVar11[6] = ((byte)(uVar9 >> 6) & 1) * auVar18[6];
      auVar11[7] = ((byte)(uVar9 >> 7) & 1) * auVar18[7];
      auVar11[8] = ((byte)(uVar9 >> 8) & 1) * auVar18[8];
      auVar11[9] = ((byte)(uVar9 >> 9) & 1) * auVar18[9];
      auVar11[10] = ((byte)(uVar9 >> 10) & 1) * auVar18[10];
      auVar11[0xb] = ((byte)(uVar9 >> 0xb) & 1) * auVar18[0xb];
      auVar11[0xc] = ((byte)(uVar9 >> 0xc) & 1) * auVar18[0xc];
      auVar11[0xd] = ((byte)(uVar9 >> 0xd) & 1) * auVar18[0xd];
      auVar11[0xe] = ((byte)(uVar9 >> 0xe) & 1) * auVar18[0xe];
      auVar11[0xf] = (char)(uVar9 >> 0xf) * auVar18[0xf];
      auVar18 = vpsrlq_avx(auVar11,0x20);
      auVar10 = vpmaxub_avx(auVar10,auVar18);
      auVar10 = vpaddb_avx(auVar10,auVar5);
      auVar1 = vpshufb_avx(auVar1,auVar10);
      *(long *)pbVar6 = auVar1._0_8_;
      uVar2 = vpextrq_avx(auVar1,1);
      *(undefined8 *)(pbVar6 + (8 - (ulong)bVar3)) = uVar2;
      pbVar6 = pbVar6 + (-(ulong)bVar3 - (ulong)bVar3) + 0x10;
    } while (0xf < length);
  }
  if (length != 0) {
    sVar7 = 0;
    do {
      bVar3 = (*(undefined1 (*) [16])src_void)[sVar7];
      *pbVar6 = bVar3;
      if (((ulong)bVar3 < 0x21) && ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)(bVar3 != 9);
      }
      pbVar6 = pbVar6 + uVar8;
      sVar7 = sVar7 + 1;
    } while (length != sVar7);
  }
  return (long)pbVar6 - (long)dst_void;
}

Assistant:

size_t despace_ssse3_cumsum( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m128i is_3or7 = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x01,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00);
	const __m128i lut_cntrl = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x01, 0x01, 0x00, 0x00, 0x01, 0x00, 0x00);
	const __m128i id = _mm_setr_epi8(
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
		0x08, 0x09, 0x0A, 0x0B, 0x0C, 0x0D, 0x0E, 0x0F);
	const __m128i mask_02 = _mm_set1_epi8(0x02);
	const __m128i mask_04 = _mm_add_epi8(mask_02, mask_02);
	const __m128i mask_20 = _mm_slli_epi64(mask_02, 4);
	const __m128i mask_70 = _mm_set1_epi8(0x70);

	for( ; length >= 16; length-=16 ){
		__m128i a,b,c,d,s,t,v;
		size_t cnt0, cnt1;

		// load
		v = _mm_loadu_si128((__m128i*)src);
		src += 16;

		// detect spaces ( 0x01 == space, 0x00 == non-space )
		s = _mm_or_si128(_mm_abs_epi8(_mm_cmpeq_epi8(mask_20, v)),
			_mm_shuffle_epi8(lut_cntrl, _mm_adds_epu8(mask_70, v)));

		// create non-space mask ( 0x00 == space, 0xFF == non-space )
		b = _mm_cmpeq_epi8(_mm_setzero_si128(), s);

		// (qword) prefix sum of spaces
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 8));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 16));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 32));

		// get non-space byte totals
		t = _mm_srli_epi64(s, 56); // hi-byte is total_spaces
		cnt0 = 8 - _mm_cvtsi128_si64(t);
		t = _mm_unpackhi_epi64(t, t);
		cnt1 = 8 - _mm_cvtsi128_si64(t);

		// compress
		b = _mm_andnot_si128(b, s); // zero non-spaces
		//
		c = _mm_srli_epi64(_mm_and_si128(mask_02, b), 9);
		d = _mm_srli_epi64(_mm_shuffle_epi8(is_3or7, b), 16);
		a = _mm_or_si128(_mm_cmpgt_epi8(mask_04, s), _mm_cmpeq_epi8(b, mask_04)); // match first 4 and below
		//
		s = _mm_add_epi8(s, c);
		s = _mm_add_epi8(s, d);
		//
		s = _mm_max_epu8(s, _mm_srli_epi64(_mm_andnot_si128(a, s), 32));
		v = _mm_shuffle_epi8(v, _mm_add_epi8(s, id));

		// store
		_mm_storel_epi64((__m128i*)dst, v);
		dst += cnt0;
		_mm_storel_epi64((__m128i*)dst, _mm_unpackhi_epi64(v, v));
		dst += cnt1;
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}